

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallclocktimer.cpp
# Opt level: O0

Real __thiscall soplex::WallclockTimer::stop(WallclockTimer *this)

{
  WallclockTimer *in_RDI;
  Real RVar1;
  timeval tp;
  timeval local_18;
  
  if ((in_RDI->super_Timer).status == RUNNING) {
    gettimeofday(&local_18,(__timezone_ptr_t)0x0);
    if (local_18.tv_usec + in_RDI->usec < 0xf4241) {
      in_RDI->sec = local_18.tv_sec + in_RDI->sec;
      in_RDI->usec = local_18.tv_usec + in_RDI->usec;
    }
    else {
      in_RDI->sec = local_18.tv_sec + 1 + in_RDI->sec;
      in_RDI->usec = in_RDI->usec - (1000000 - local_18.tv_usec);
    }
    (in_RDI->super_Timer).status = STOPPED;
    RVar1 = wall2sec(in_RDI,in_RDI->sec,in_RDI->usec);
    in_RDI->lasttime = RVar1;
  }
  return in_RDI->lasttime;
}

Assistant:

Real WallclockTimer::stop()
{
   // status remains unchanged if timer is not running
   if(status == RUNNING)
   {
#if !defined(_WIN32) && !defined(_WIN64)
      struct timeval tp; /*lint !e86*/
#endif

#if defined(_WIN32) || defined(_WIN64)
      // we need the blank specifier to distiguish this method from WallclockTimer::time
      sec += ::time(nullptr);
#else
      gettimeofday(&tp, nullptr);

      if(tp.tv_usec + usec > 1000000)   /*lint !e115 !e40*/
      {
         sec += (tp.tv_sec + 1); /*lint !e115 !e40*/
         usec -= (1000000 - tp.tv_usec); /*lint !e115 !e40*/
      }
      else
      {
         sec += tp.tv_sec; /*lint !e115 !e40*/
         usec += tp.tv_usec; /*lint !e115 !e40*/
      }

#endif
      status = STOPPED;
      lasttime = wall2sec(sec, usec);
   }

   return lasttime;
}